

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O0

void __thiscall
helics::MessageFederate::MessageFederate
          (MessageFederate *this,string_view fedName,string *configString)

{
  undefined8 *in_RDI;
  FederateInfo *in_stack_fffffffffffffdf0;
  MessageFederate *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe78;
  FederateInfo *in_stack_fffffffffffffe88;
  Federate *in_stack_fffffffffffffe90;
  string_view in_stack_fffffffffffffe98;
  
  loadFederateInfo(in_stack_fffffffffffffe78);
  Federate::Federate(in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,in_stack_fffffffffffffe88);
  FederateInfo::~FederateInfo(in_stack_fffffffffffffdf0);
  *in_RDI = 0xa3f8f8;
  in_RDI[2] = 0xa3f9c0;
  std::
  unique_ptr<helics::MessageFederateManager,std::default_delete<helics::MessageFederateManager>>::
  unique_ptr<std::default_delete<helics::MessageFederateManager>,void>
            ((unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
              *)(in_RDI + 1));
  loadFederateData(in_stack_fffffffffffffe10);
  return;
}

Assistant:

MessageFederate::MessageFederate(std::string_view fedName, const std::string& configString):
    Federate(fedName, loadFederateInfo(configString))
{
    loadFederateData();
}